

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_channel_map_is_valid(ma_channel *pChannelMap,ma_uint32 channels)

{
  ma_channel mVar1;
  ma_uint32 iChannel;
  ma_uint32 channelIndex;
  
  if (channels != 0) {
    if (channels == 1) {
LAB_00160305:
      channels = 1;
    }
    else {
      channelIndex = 0;
      do {
        if (channels == channelIndex) goto LAB_00160305;
        mVar1 = ma_channel_map_get_channel(pChannelMap,channels,channelIndex);
        channelIndex = channelIndex + 1;
      } while (mVar1 != '\x01');
      channels = 0;
    }
  }
  return channels;
}

Assistant:

MA_API ma_bool32 ma_channel_map_is_valid(const ma_channel* pChannelMap, ma_uint32 channels)
{
    /* A channel count of 0 is invalid. */
    if (channels == 0) {
        return MA_FALSE;
    }

    /* It does not make sense to have a mono channel when there is more than 1 channel. */
    if (channels > 1) {
        ma_uint32 iChannel;
        for (iChannel = 0; iChannel < channels; ++iChannel) {
            if (ma_channel_map_get_channel(pChannelMap, channels, iChannel) == MA_CHANNEL_MONO) {
                return MA_FALSE;
            }
        }
    }

    return MA_TRUE;
}